

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O3

void __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
::RenderDeviceNextGenBase
          (RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           *this,IReferenceCounters *pRefCounters,IMemoryAllocator *RawMemAllocator,
          IEngineFactory *pEngineFactory,size_t CmdQueueCount,ICommandQueueVk **Queues,
          EngineCreateInfo *EngineCI,GraphicsAdapterInfo *AdapterInfo)

{
  IMemoryAllocator *pIVar1;
  CommandQueue *pCVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  long lVar5;
  RefCntAutoPtr<Diligent::ICommandQueueVk> local_58;
  string local_50;
  
  RenderDeviceBase<Diligent::EngineVkImplTraits>::RenderDeviceBase
            (&this->super_RenderDeviceBase<Diligent::EngineVkImplTraits>,pRefCounters,
             RawMemAllocator,pEngineFactory,EngineCI,AdapterInfo);
  (this->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).
  super_ObjectBase<Diligent::IRenderDeviceVk>.super_RefCountedObject<Diligent::IRenderDeviceVk>.
  super_IRenderDeviceVk.super_IRenderDevice.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_0091f2d0;
  this->m_CmdQueueCount = CmdQueueCount;
  this->m_CommandQueues = (CommandQueue *)0x0;
  if (0x3f < CmdQueueCount) {
    FormatString<char[68],unsigned_int,char[2]>
              (&local_50,
               (Diligent *)"The number of command queue is greater than maximum allowed value (",
               (char (*) [68])&MAX_COMMAND_QUEUES,(uint *)0x73bf31,(char (*) [2])EngineCI);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"RenderDeviceNextGenBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x42);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    CmdQueueCount = this->m_CmdQueueCount;
  }
  pIVar1 = (this->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_RawMemAllocator;
  iVar3 = (**pIVar1->_vptr_IMemoryAllocator)
                    (pIVar1,CmdQueueCount * 0x168,"Raw memory for the device command/release queues"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
                     ,0x44);
  this->m_CommandQueues = (CommandQueue *)CONCAT44(extraout_var,iVar3);
  if (this->m_CmdQueueCount != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      pCVar2 = this->m_CommandQueues;
      local_58.m_pObject = Queues[uVar4];
      if (local_58.m_pObject != (ICommandQueueVk *)0x0) {
        (*((local_58.m_pObject)->super_ICommandQueue).super_IObject._vptr_IObject[1])();
      }
      CommandQueue::CommandQueue
                ((CommandQueue *)((long)&(pCVar2->Mtx).super___mutex_base._M_mutex + lVar5),
                 &local_58,
                 (this->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_RawMemAllocator);
      if (local_58.m_pObject != (ICommandQueueVk *)0x0) {
        (*((local_58.m_pObject)->super_ICommandQueue).super_IObject._vptr_IObject[2])();
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x168;
    } while (uVar4 < this->m_CmdQueueCount);
  }
  return;
}

Assistant:

RenderDeviceNextGenBase(IReferenceCounters*        pRefCounters,
                            IMemoryAllocator&          RawMemAllocator,
                            IEngineFactory*            pEngineFactory,
                            size_t                     CmdQueueCount,
                            CommandQueueType**         Queues,
                            const EngineCreateInfo&    EngineCI,
                            const GraphicsAdapterInfo& AdapterInfo) :
        TBase{pRefCounters, RawMemAllocator, pEngineFactory, EngineCI, AdapterInfo},
        m_CmdQueueCount{CmdQueueCount}
    {
        VERIFY(m_CmdQueueCount < MAX_COMMAND_QUEUES, "The number of command queue is greater than maximum allowed value (", MAX_COMMAND_QUEUES, ")");

        m_CommandQueues = ALLOCATE(this->m_RawMemAllocator, "Raw memory for the device command/release queues", CommandQueue, m_CmdQueueCount);
        for (size_t q = 0; q < m_CmdQueueCount; ++q)
            new (m_CommandQueues + q) CommandQueue{RefCntAutoPtr<CommandQueueType>(Queues[q]), this->m_RawMemAllocator};
    }